

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

bool P_IsTIDUsed(int tid)

{
  AActor *pAVar1;
  AActor **ppAVar2;
  
  ppAVar2 = AActor::TIDHash + (tid & 0x7f);
  do {
    pAVar1 = *ppAVar2;
    if (pAVar1 == (AActor *)0x0) break;
    ppAVar2 = &pAVar1->inext;
  } while (pAVar1->tid != tid);
  return pAVar1 != (AActor *)0x0;
}

Assistant:

bool P_IsTIDUsed(int tid)
{
	AActor *probe = AActor::TIDHash[tid & 127];
	while (probe != NULL)
	{
		if (probe->tid == tid)
		{
			return true;
		}
		probe = probe->inext;
	}
	return false;
}